

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

int __thiscall re2::DFA::BuildAllStates(DFA *this)

{
  State *state;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  int c;
  vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> q;
  State *ns;
  __node_gen_type __node_gen;
  RWLocker l;
  StateSet queued;
  State **local_f8;
  iterator iStack_f0;
  State **local_e8;
  State *local_e0;
  _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_d8;
  RWLocker local_d0;
  _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_c0;
  SearchParams local_88;
  
  iVar2 = 0;
  if (this->init_failed_ == false) {
    local_d0.mu_ = &this->cache_mutex_;
    local_d0.writing_ = false;
    iVar2 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_d0.mu_);
    if (iVar2 != 0) {
      abort();
    }
    iVar2 = 0;
    local_88.text.ptr_ = (char *)0x0;
    local_88.text.length_ = 0;
    local_88.context.ptr_ = (char *)0x0;
    local_88.context.length_ = 0;
    local_88.anchored = false;
    local_88.want_earliest_match = false;
    local_88.run_forward = false;
    local_88.start = (State *)0x0;
    local_88.firstbyte = -1;
    local_88.cache_lock = &local_d0;
    local_88.failed = false;
    local_88.ep = (char *)0x0;
    local_88.matches = (vector<int,_std::allocator<int>_> *)0x0;
    bVar1 = AnalyzeSearch(this,&local_88);
    if (bVar1 && (State *)0x2 < local_88.start) {
      local_c0._M_buckets = &local_c0._M_single_bucket;
      local_c0._M_bucket_count = 1;
      local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_c0._M_element_count = 0;
      local_c0._M_rehash_policy._M_max_load_factor = 1.0;
      local_c0._M_rehash_policy._M_next_resize = 0;
      local_c0._M_single_bucket = (__node_base_ptr)0x0;
      local_f8 = (State **)0x0;
      iStack_f0._M_current = (State **)0x0;
      local_e8 = (State **)0x0;
      local_d8 = &local_c0;
      std::
      _Hashtable<re2::DFA::State*,re2::DFA::State*,std::allocator<re2::DFA::State*>,std::__detail::_Identity,re2::DFA::StateEqual,re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<re2::DFA::State*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<re2::DFA::State*,true>>>>
                ((_Hashtable<re2::DFA::State*,re2::DFA::State*,std::allocator<re2::DFA::State*>,std::__detail::_Identity,re2::DFA::StateEqual,re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_c0,&local_88.start);
      if (iStack_f0._M_current == local_e8) {
        std::vector<re2::DFA::State*,std::allocator<re2::DFA::State*>>::
        _M_realloc_insert<re2::DFA::State*const&>
                  ((vector<re2::DFA::State*,std::allocator<re2::DFA::State*>> *)&local_f8,iStack_f0,
                   &local_88.start);
      }
      else {
        *iStack_f0._M_current = local_88.start;
        iStack_f0._M_current = iStack_f0._M_current + 1;
      }
      if (iStack_f0._M_current == local_f8) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        do {
          state = local_f8[uVar5];
          iVar2 = 0;
          do {
            local_e0 = RunStateOnByteUnlocked(this,state,iVar2);
            if (((State *)0x2 < local_e0) &&
               (iVar3 = std::
                        _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::find(&local_c0,&local_e0),
               iVar3.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur == (__node_type *)0x0
               )) {
              local_d8 = &local_c0;
              std::
              _Hashtable<re2::DFA::State*,re2::DFA::State*,std::allocator<re2::DFA::State*>,std::__detail::_Identity,re2::DFA::StateEqual,re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<re2::DFA::State*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<re2::DFA::State*,true>>>>
                        ((_Hashtable<re2::DFA::State*,re2::DFA::State*,std::allocator<re2::DFA::State*>,std::__detail::_Identity,re2::DFA::StateEqual,re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_c0,&local_e0,&local_d8);
              if (iStack_f0._M_current == local_e8) {
                std::vector<re2::DFA::State*,std::allocator<re2::DFA::State*>>::
                _M_realloc_insert<re2::DFA::State*const&>
                          ((vector<re2::DFA::State*,std::allocator<re2::DFA::State*>> *)&local_f8,
                           iStack_f0,&local_e0);
              }
              else {
                *iStack_f0._M_current = local_e0;
                iStack_f0._M_current = iStack_f0._M_current + 1;
              }
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 != 0x101);
          uVar5 = uVar5 + 1;
          uVar4 = (long)iStack_f0._M_current - (long)local_f8 >> 3;
        } while (uVar5 < uVar4);
      }
      iVar2 = (int)uVar4;
      if (local_f8 != (State **)0x0) {
        operator_delete(local_f8);
      }
      std::
      _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_c0);
    }
    RWLocker::~RWLocker(&local_d0);
  }
  return iVar2;
}

Assistant:

int DFA::BuildAllStates() {
  if (!ok())
    return 0;

  // Pick out start state for unanchored search
  // at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(NULL, NULL, &l);
  params.anchored = false;
  if (!AnalyzeSearch(&params) || params.start <= SpecialStateMax)
    return 0;

  // Add start state to work queue.
  StateSet queued;
  vector<State*> q;
  queued.insert(params.start);
  q.push_back(params.start);

  // Flood to expand every state.
  for (size_t i = 0; i < q.size(); i++) {
    State* s = q[i];
    for (int c = 0; c < 257; c++) {
      State* ns = RunStateOnByteUnlocked(s, c);
      if (ns > SpecialStateMax && queued.find(ns) == queued.end()) {
        queued.insert(ns);
        q.push_back(ns);
      }
    }
  }

  return static_cast<int>(q.size());
}